

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
                 (UnknownFieldSet *unknown_fields)

{
  int iVar1;
  Type TVar2;
  size_t sVar3;
  size_t sVar4;
  int field_size;
  UnknownField *field;
  int i;
  size_t size;
  UnknownField *in_stack_00000040;
  int in_stack_ffffffffffffffdc;
  UnknownField *in_stack_ffffffffffffffe0;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0;
  local_14 = 0;
  while( true ) {
    iVar1 = UnknownFieldSet::field_count((UnknownFieldSet *)0x45537b);
    if (iVar1 <= local_14) break;
    in_stack_ffffffffffffffe0 =
         UnknownFieldSet::field
                   ((UnknownFieldSet *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    TVar2 = UnknownField::type(in_stack_ffffffffffffffe0);
    if (TVar2 == TYPE_LENGTH_DELIMITED) {
      UnknownField::number(in_stack_ffffffffffffffe0);
      sVar3 = io::CodedOutputStream::VarintSize32(0);
      sVar4 = UnknownField::GetLengthDelimitedSize(in_stack_00000040);
      in_stack_ffffffffffffffdc = (int)sVar4;
      sVar4 = io::CodedOutputStream::VarintSize32(0);
      local_10 = (long)in_stack_ffffffffffffffdc + sVar4 + sVar3 + local_10 + 4;
    }
    local_14 = local_14 + 1;
  }
  return local_10;
}

Assistant:

size_t WireFormat::ComputeUnknownMessageSetItemsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      size += WireFormatLite::kMessageSetItemTagsSize;
      size += io::CodedOutputStream::VarintSize32(field.number());

      int field_size = field.GetLengthDelimitedSize();
      size += io::CodedOutputStream::VarintSize32(field_size);
      size += field_size;
    }
  }

  return size;
}